

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DebugNodeWindowsList(ImVector<ImGuiWindow_*> *windows,char *label)

{
  bool bVar1;
  ImGuiWindow **ppIVar2;
  int local_1c;
  int i;
  char *label_local;
  ImVector<ImGuiWindow_*> *windows_local;
  
  bVar1 = TreeNode(label,"%s (%d)",label,(ulong)(uint)windows->Size);
  if (bVar1) {
    Text("(In front-to-back order:)");
    local_1c = windows->Size;
    while (local_1c = local_1c + -1, -1 < local_1c) {
      ppIVar2 = ImVector<ImGuiWindow_*>::operator[](windows,local_1c);
      PushID(*ppIVar2);
      ppIVar2 = ImVector<ImGuiWindow_*>::operator[](windows,local_1c);
      DebugNodeWindow(*ppIVar2,"Window");
      PopID();
    }
    TreePop();
  }
  return;
}

Assistant:

void ImGui::DebugNodeWindowsList(ImVector<ImGuiWindow*>* windows, const char* label)
{
    if (!TreeNode(label, "%s (%d)", label, windows->Size))
        return;
    Text("(In front-to-back order:)");
    for (int i = windows->Size - 1; i >= 0; i--) // Iterate front to back
    {
        PushID((*windows)[i]);
        DebugNodeWindow((*windows)[i], "Window");
        PopID();
    }
    TreePop();
}